

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * __thiscall ODDLParser::OpenDDLParser::parseHeader(OpenDDLParser *this,char *in,char *end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  pointer ppDVar2;
  bool bVar3;
  Property *pPVar4;
  Name *pNVar5;
  Text *this_00;
  byte bVar6;
  byte *pbVar7;
  size_t sVar8;
  byte *pbVar9;
  DDLNode *parent;
  pointer *__ptr;
  ulong uVar10;
  Property *pPVar11;
  pointer __p;
  string type;
  Property *prop_;
  Text *id;
  Name *name_;
  Property *local_b8;
  Property *local_b0;
  Property *local_a8;
  DDLNode *local_a0;
  OpenDDLParser *local_98;
  string local_90;
  Property *local_70;
  Name *local_68;
  ulong local_60;
  Text *local_58;
  string local_50;
  
  if (in == end || in == (char *)0x0) {
    return in;
  }
  local_58 = (Text *)0x0;
  pbVar7 = (byte *)parseIdentifier(in,end,&local_58);
  this_00 = local_58;
  pbVar9 = pbVar7;
  while (((pbVar7 != (byte *)end && (pbVar9 = pbVar7, (ulong)*pbVar7 < 0x2d)) &&
         ((0x100100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
    pbVar7 = pbVar7 + 1;
    pbVar9 = (byte *)end;
  }
  if (local_58 == (Text *)0x0) {
    return (char *)pbVar9;
  }
  __s = local_58->m_buffer;
  local_98 = this;
  if (__s == (char *)0x0) {
LAB_00666455:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"nullptr returned by creating DDLNode.",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    uVar10 = 0;
    local_a0 = (DDLNode *)0x0;
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    sVar8 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar8);
    ppDVar2 = (local_98->m_stack).
              super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((local_98->m_stack).
        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
        super__Vector_impl_data._M_start == ppDVar2) {
      parent = (DDLNode *)0x0;
    }
    else {
      parent = ppDVar2[-1];
    }
    paVar1 = &local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar1;
    local_a0 = DDLNode::create(&local_90,&local_50,parent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_a0 == (DDLNode *)0x0) goto LAB_00666455;
    pushNode(local_98,local_a0);
    uVar10 = CONCAT71((int7)((ulong)paVar1 >> 8),1);
  }
  Text::~Text(this_00);
  operator_delete(this_00);
  local_50._M_dataplus._M_p = (pointer)0x0;
  pbVar7 = (byte *)parseName((char *)pbVar9,end,(Name **)&local_50);
  local_68 = (Name *)local_50._M_dataplus._M_p;
  uVar10 = uVar10 ^ 1;
  if ((Name *)local_50._M_dataplus._M_p != (Name *)0x0 && (char)uVar10 == '\0') {
    std::__cxx11::string::string
              ((string *)&local_90,(*(Text **)(local_50._M_dataplus._M_p + 8))->m_buffer,
               (allocator *)&local_b0);
    DDLNode::setName(local_a0,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  local_b0 = (Property *)0x0;
  pbVar9 = pbVar7;
  for (; pbVar7 != (byte *)end; pbVar7 = pbVar7 + 1) {
    bVar6 = *pbVar7;
    pbVar9 = pbVar7;
    if ((0x2c < (ulong)bVar6) || ((0x100100002600U >> ((ulong)bVar6 & 0x3f) & 1) == 0))
    goto LAB_00666554;
    pbVar9 = (byte *)end;
  }
  bVar6 = *pbVar9;
LAB_00666554:
  if (bVar6 == 0x28) {
    pbVar7 = pbVar9 + 1;
    local_b8 = (Property *)0x0;
    local_a8 = (Property *)0x0;
    local_60 = uVar10;
    if ((pbVar7 != (byte *)end) && (pbVar9[1] != 0x29)) {
      do {
        pPVar4 = local_b8;
        local_70 = (Property *)0x0;
        pbVar9 = (byte *)parseProperty((char *)pbVar7,end,&local_70);
        pPVar11 = local_70;
        local_b8 = local_70;
        pbVar7 = pbVar9;
        if (pPVar4 != (Property *)0x0) {
          Property::~Property(pPVar4);
          operator_delete(pPVar4);
        }
        for (; pPVar4 = local_a8, pbVar9 != (byte *)end; pbVar9 = pbVar9 + 1) {
          bVar6 = *pbVar9;
          pbVar7 = pbVar9;
          if ((0x2c < (ulong)bVar6) || ((0x100100002600U >> ((ulong)bVar6 & 0x3f) & 1) == 0))
          goto LAB_006665e6;
          pbVar7 = (byte *)end;
        }
        bVar6 = *pbVar7;
LAB_006665e6:
        if ((bVar6 != 0x29) && (bVar6 != 0x2c)) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,")","");
          logInvalidTokenError((char *)pbVar7,&local_90,local_98->m_logCallback);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          bVar3 = false;
          goto LAB_00666661;
        }
        if (bVar6 != 0x2c && pPVar11 != (Property *)0x0) {
          if (local_b0 == (Property *)0x0) {
            local_b0 = pPVar11;
            pPVar11 = (Property *)0x0;
          }
          if (local_a8 == (Property *)0x0) {
            local_b8 = (Property *)0x0;
            local_a8 = pPVar11;
          }
          else {
            local_a8->m_next = pPVar11;
            local_b8 = (Property *)0x0;
            local_a8 = (Property *)0x0;
            Property::~Property(pPVar4);
            operator_delete(pPVar4);
          }
        }
      } while ((pbVar7 != (byte *)end) && (*pbVar7 != 0x29));
    }
    pbVar7 = pbVar7 + 1;
    bVar3 = true;
LAB_00666661:
    pPVar4 = local_a8;
    if (local_a8 != (Property *)0x0) {
      Property::~Property(local_a8);
      operator_delete(pPVar4);
    }
    if (local_b8 != (Property *)0x0) {
      Property::~Property(local_b8);
      operator_delete(local_b8);
    }
    pPVar4 = local_b0;
    if (bVar3) {
      if ((char)local_60 == '\0' && local_b0 != (Property *)0x0) {
        local_b0 = (Property *)0x0;
        DDLNode::setProperties(local_a0,pPVar4);
        pbVar9 = pbVar7;
        goto LAB_006666e1;
      }
    }
    else {
      pbVar7 = (byte *)0x0;
    }
    pbVar9 = pbVar7;
    if (local_b0 != (Property *)0x0) {
      Property::~Property(local_b0);
      operator_delete(pPVar4);
    }
  }
LAB_006666e1:
  pNVar5 = local_68;
  if (local_68 != (Name *)0x0) {
    Name::~Name(local_68);
    operator_delete(pNVar5);
  }
  return (char *)pbVar9;
}

Assistant:

char *OpenDDLParser::parseHeader( char *in, char *end ) {
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    Text *id( ddl_nullptr );
    in = OpenDDLParser::parseIdentifier( in, end, &id );

#ifdef DEBUG_HEADER_NAME
    dumpId( id );
#endif // DEBUG_HEADER_NAME

    in = lookForNextToken( in, end );
    if( ddl_nullptr != id ) {
        // store the node
        DDLNode *node( createDDLNode( id, this ) );
        if( ddl_nullptr != node ) {
            pushNode( node );
        } else {
            std::cerr << "nullptr returned by creating DDLNode." << std::endl;
        }
        delete id;

		Name *name_(ddl_nullptr);
		in = OpenDDLParser::parseName(in, end, &name_);
		std::unique_ptr<Name> name(name_);
        if( ddl_nullptr != name && ddl_nullptr != node ) {
            const std::string nodeName( name->m_id->m_buffer );
            node->setName( nodeName );
        }


		std::unique_ptr<Property> first;
		in = lookForNextToken(in, end);
		if (*in == Grammar::OpenPropertyToken[0]) {
			in++;
			std::unique_ptr<Property> prop, prev;
			while (*in != Grammar::ClosePropertyToken[0] && in != end) {
				Property *prop_(ddl_nullptr);
				in = OpenDDLParser::parseProperty(in, end, &prop_);
				prop.reset(prop_);
				in = lookForNextToken(in, end);

				if (*in != Grammar::CommaSeparator[0] && *in != Grammar::ClosePropertyToken[0]) {
					logInvalidTokenError(in, Grammar::ClosePropertyToken, m_logCallback);
					return ddl_nullptr;
				}

				if (ddl_nullptr != prop && *in != Grammar::CommaSeparator[0]) {
					if (ddl_nullptr == first) {
						first = std::move(prop);
					}
					if (ddl_nullptr != prev) {
						prev->m_next = prop.release();
					}
					prev = std::move(prop);
				}
			}
			++in;
		}

		// set the properties
		if (first && ddl_nullptr != node) {
			node->setProperties(first.release());
		}
    }

    return in;
}